

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall doctest::String::operator+=(String *this,String *other)

{
  char *pcVar1;
  char cVar2;
  char *__src;
  char *__src_00;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_t __size;
  
  __src = other->m_str;
  if (__src != (char *)0x0) {
    __src_00 = this->m_str;
    pcVar4 = __src_00;
    if (__src_00 != (char *)0x0) {
      pcVar3 = __src_00 + -1;
      do {
        pcVar4 = pcVar3 + 1;
        pcVar5 = pcVar3 + 1;
        pcVar3 = pcVar4;
      } while (*pcVar5 != '\0');
    }
    __size = (long)pcVar4 - (long)__src_00;
    pcVar4 = __src;
    do {
      __size = __size + 1;
      cVar2 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar2 != '\0');
    pcVar3 = (char *)malloc(__size);
    strcpy(pcVar3,__src_00);
    pcVar4 = __src_00;
    if (__src_00 != (char *)0x0) {
      pcVar5 = __src_00 + -1;
      do {
        pcVar4 = pcVar5 + 1;
        pcVar1 = pcVar5 + 1;
        pcVar5 = pcVar4;
      } while (*pcVar1 != '\0');
    }
    strcpy(pcVar3 + ((long)pcVar4 - (long)__src_00),__src);
    free(__src_00);
    this->m_str = pcVar3;
  }
  return this;
}

Assistant:

String& String::operator+=(const String& other) {
    using namespace detail;
    if(other.m_str != 0) {
        char* newStr = static_cast<char*>(malloc(my_strlen(m_str) + my_strlen(other.m_str) + 1));
        strcpy(newStr, m_str);
        strcpy(newStr + my_strlen(m_str), other.m_str);
        free(m_str);
        m_str = newStr;
    }
    return *this;
}